

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_util.cpp
# Opt level: O2

bool saveToFile(string *filePath,void *data,size_t dataSize)

{
  ofstream file;
  
  std::ofstream::ofstream(&file);
  std::ios::exceptions
            ((int)&file +
             (int)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]);
  std::ofstream::open((string *)&file,(_Ios_Openmode)filePath);
  std::ostream::write((char *)&file,(long)data);
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  return true;
}

Assistant:

bool saveToFile(const std::string& filePath, const void* data, size_t dataSize)
{
	try {
		std::ofstream file;
		file.exceptions(std::ofstream::failbit | std::ofstream::badbit);
		file.open(filePath, std::ofstream::out | std::ofstream::binary);
		file.write(reinterpret_cast<const char*>(data), dataSize);
		file.close();
		return true;
	}
	catch (const std::ios_base::failure& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}